

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O2

void __thiscall
CRegexStack::swap_and_pop
          (CRegexStack *this,int *start_ofs,int *str_ofs,size_t *curlen,re_state_id *state,
          re_state_id *final,re_group_register_conflict *regs,short *loop_vars,int *iter)

{
  swap(this,start_ofs,str_ofs,curlen,state,final,regs,loop_vars);
  *iter = *(int *)(this->buf_ + (long)this->sp_ + 0x1c);
  this->used_ = (long)this->sp_;
  this->sp_ = *(int *)(this->buf_ + (long)this->sp_ + 0x20);
  return;
}

Assistant:

void swap_and_pop(int *start_ofs, int *str_ofs, size_t *curlen,
                      re_state_id *state, re_state_id *final,
                      re_group_register *regs, short *loop_vars, int *iter)
    {
        /* swap the current state wtih the top of stack */
        swap(start_ofs, str_ofs, curlen, state, final, regs, loop_vars);

        /* save the return value from the outgoing state */
        regex_stack_entry *fp = (regex_stack_entry *)(buf_ + sp_);
        *iter = fp->iter;

        /* discard the frame */
        discard();
    }